

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O2

void __thiscall DisasmReplayer::~DisasmReplayer(DisasmReplayer *this)

{
  ~DisasmReplayer(this);
  operator_delete(this,0x310);
  return;
}

Assistant:

~DisasmReplayer()
	{
		if (device)
		{
			if (pipeline_cache)
				vkDestroyPipelineCache(device->get_device(), pipeline_cache, nullptr);
			for (auto &sampler : samplers)
				if (sampler)
					vkDestroySampler(device->get_device(), sampler, nullptr);
			for (auto &layout : layouts)
				if (layout)
					vkDestroyDescriptorSetLayout(device->get_device(), layout, nullptr);
			for (auto &pipeline_layout : pipeline_layouts)
				if (pipeline_layout)
					vkDestroyPipelineLayout(device->get_device(), pipeline_layout, nullptr);
			for (auto &shader_module : shader_modules)
				if (shader_module)
					vkDestroyShaderModule(device->get_device(), shader_module, nullptr);
			for (auto &render_pass : render_passes)
				if (render_pass)
					vkDestroyRenderPass(device->get_device(), render_pass, nullptr);
			for (auto &pipeline : compute_pipelines)
				if (pipeline)
					vkDestroyPipeline(device->get_device(), pipeline, nullptr);
			for (auto &pipeline : graphics_pipelines)
				if (pipeline)
					vkDestroyPipeline(device->get_device(), pipeline, nullptr);
			for (auto &pipeline : raytracing_pipelines)
				if (pipeline)
					vkDestroyPipeline(device->get_device(), pipeline, nullptr);
		}
	}